

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O0

void lh_rebucket(_LHASH *lh,size_t new_num_buckets)

{
  lhash_item_st *plVar1;
  LHASH_ITEM **ppLVar2;
  ulong uVar3;
  size_t new_bucket;
  size_t alloc_size;
  size_t i;
  LHASH_ITEM *next;
  LHASH_ITEM *cur;
  LHASH_ITEM **new_buckets;
  size_t new_num_buckets_local;
  _LHASH *lh_local;
  
  if (((new_num_buckets & 0x1fffffffffffffff) == new_num_buckets) &&
     (ppLVar2 = (LHASH_ITEM **)OPENSSL_zalloc(new_num_buckets << 3), ppLVar2 != (LHASH_ITEM **)0x0))
  {
    for (alloc_size = 0; alloc_size < lh->num_buckets; alloc_size = alloc_size + 1) {
      next = lh->buckets[alloc_size];
      while (next != (LHASH_ITEM *)0x0) {
        uVar3 = (ulong)next->hash % new_num_buckets;
        plVar1 = next->next;
        next->next = ppLVar2[uVar3];
        ppLVar2[uVar3] = next;
        next = plVar1;
      }
    }
    OPENSSL_free(lh->buckets);
    lh->num_buckets = new_num_buckets;
    lh->buckets = ppLVar2;
  }
  return;
}

Assistant:

static void lh_rebucket(_LHASH *lh, const size_t new_num_buckets) {
  LHASH_ITEM **new_buckets, *cur, *next;
  size_t i, alloc_size;

  alloc_size = sizeof(LHASH_ITEM *) * new_num_buckets;
  if (alloc_size / sizeof(LHASH_ITEM *) != new_num_buckets) {
    return;
  }

  new_buckets = reinterpret_cast<LHASH_ITEM **>(OPENSSL_zalloc(alloc_size));
  if (new_buckets == NULL) {
    return;
  }

  for (i = 0; i < lh->num_buckets; i++) {
    for (cur = lh->buckets[i]; cur != NULL; cur = next) {
      const size_t new_bucket = cur->hash % new_num_buckets;
      next = cur->next;
      cur->next = new_buckets[new_bucket];
      new_buckets[new_bucket] = cur;
    }
  }

  OPENSSL_free(lh->buckets);

  lh->num_buckets = new_num_buckets;
  lh->buckets = new_buckets;
}